

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::jacobiSVD<double>
               (Matrix33<double> *A,Matrix33<double> *U,Vec3<double> *S,Matrix33<double> *V,
               double tol,bool forcePositiveDeterminant)

{
  Matrix33<double> *in_RDI;
  byte in_R8B;
  double unaff_retaddr;
  Matrix33<double> *in_stack_00000008;
  Vec3<double> *in_stack_00000010;
  Matrix33<double> *in_stack_00000018;
  Matrix33<double> *in_stack_00000020;
  Matrix33<double> MStack_78;
  byte local_29;
  
  local_29 = in_R8B & 1;
  Matrix33<double>::Matrix33(&MStack_78,in_RDI);
  anon_unknown_20::twoSidedJacobiSVD<double>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec3<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}